

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O2

void registerExpressionFunctions(ExpressionFunctionHandler *handler)

{
  long lVar1;
  allocator<char> local_91;
  string local_90 [32];
  string local_70;
  string local_50;
  
  for (lVar1 = 0x20; lVar1 != 0x4f8; lVar1 = lVar1 + 0x28) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               *(char **)((long)&std::__detail::__variant::
                                 __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<std::monostate,_long,_double,_StringLiteral,_Identifier>_&>
                                 ::_S_vtable._M_arr[3]._M_data + lVar1),&local_91);
    Identifier::Identifier((Identifier *)local_90,&local_50);
    ExpressionFunctionHandler::addFunction
              (handler,(Identifier *)local_90,
               *(ExpressionFunction *)
                ((long)&std::__detail::__variant::
                        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<std::monostate,_long,_double,_StringLiteral,_Identifier>_&>
                        ::_S_vtable._M_arr[4]._M_data + lVar1),
               *(size_t *)
                ((long)&std::__detail::__variant::
                        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<std::monostate,_long,_double,_StringLiteral,_Identifier>_&>
                        ::_S_vtable._M_arr[5]._M_data + lVar1),*(size_t *)(&UNK_001b3cd8 + lVar1),
               *(ExpFuncSafety *)((long)&expressionFunctions[0].name + lVar1));
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  for (lVar1 = 0x20; lVar1 != 0xc0; lVar1 = lVar1 + 0x28) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,*(char **)((long)&expressionFunctions[0x1e].minParams + lVar1),
               &local_91);
    Identifier::Identifier((Identifier *)local_90,&local_70);
    ExpressionFunctionHandler::addLabelFunction
              (handler,(Identifier *)local_90,
               *(ExpressionLabelFunction *)((long)&expressionFunctions[0x1e].maxParams + lVar1),
               *(size_t *)((long)&expressionFunctions[0x1e].safety + lVar1),
               *(size_t *)(&UNK_001b41b8 + lVar1),
               *(ExpFuncSafety *)((long)&expressionLabelFunctions[0].name + lVar1));
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return;
}

Assistant:

void registerExpressionFunctions(ExpressionFunctionHandler &handler)
{
	for (const auto &func : expressionFunctions)
	{
		handler.addFunction(Identifier(func.name), func.function, func.minParams, func.maxParams, func.safety);
	}

	for (const auto &func : expressionLabelFunctions)
	{
		handler.addLabelFunction(Identifier(func.name), func.function, func.minParams, func.maxParams, func.safety);
	}
}